

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

int WallMost(short *mostbuf,secplane_t *plane,FWallCoords *wallc)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar13;
  short sVar14;
  int iVar15;
  vertex_t *pvVar16;
  uint uVar17;
  uint *puVar18;
  uint *puVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  short sVar29;
  int iVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar49;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar50;
  float fVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar92;
  int iVar93;
  int iVar100;
  undefined1 auVar94 [16];
  int iVar101;
  undefined1 auVar95 [16];
  int iVar102;
  undefined1 auVar96 [16];
  int iVar103;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  double dVar113;
  double dVar114;
  double local_68;
  
  sVar13 = (short)viewheight;
  auVar12 = _DAT_0073b300;
  dVar113 = (plane->normal).X;
  dVar41 = (plane->normal).Y;
  if (dVar41 == 0.0 && dVar113 == 0.0) {
    iVar30 = OWallMost(mostbuf,plane->D * plane->negiC - ViewPos.Z,wallc);
    return iVar30;
  }
  if (((byte)MirrorFlags & 1) == 0) {
    dVar46 = (curline->v1->p).X;
    dVar52 = (curline->v1->p).Y;
    iVar30 = (int)wallc->sx1;
    dVar45 = dVar46;
    dVar44 = dVar52;
    if (iVar30 == 0) {
      uVar1 = *(undefined8 *)&(wallc->tleft).Y;
      fVar37 = (wallc->tleft).X + (float)uVar1;
      fVar40 = fVar37 - ((wallc->tright).Y + (float)((ulong)uVar1 >> 0x20));
      if (fVar40 != 0.0) {
        dVar44 = (double)fVar37 / (double)fVar40;
        dVar45 = dVar44 * ((curline->v2->p).X - dVar46) + dVar46;
        dVar44 = dVar44 * ((curline->v2->p).Y - dVar52) + dVar52;
      }
    }
    dVar31 = plane->D;
    dVar114 = plane->negiC;
    dVar44 = ViewPos.Z - (dVar44 * dVar41 + dVar45 * dVar113 + dVar31) * dVar114;
    sVar14 = wallc->sx2;
    iVar27 = (int)sVar14;
    dVar45 = dVar44;
    if (iVar27 <= iVar30 + 1) goto LAB_0030cc47;
    pvVar16 = curline->v2;
  }
  else {
    dVar46 = (curline->v2->p).X;
    dVar52 = (curline->v2->p).Y;
    iVar30 = (int)wallc->sx1;
    dVar45 = dVar46;
    dVar44 = dVar52;
    if (iVar30 == 0) {
      uVar1 = *(undefined8 *)&(wallc->tleft).Y;
      fVar37 = (wallc->tleft).X + (float)uVar1;
      fVar40 = fVar37 - ((wallc->tright).Y + (float)((ulong)uVar1 >> 0x20));
      if (fVar40 != 0.0) {
        dVar44 = (double)fVar37 / (double)fVar40;
        dVar45 = dVar44 * ((curline->v1->p).X - dVar46) + dVar46;
        dVar44 = dVar44 * ((curline->v1->p).Y - dVar52) + dVar52;
      }
    }
    dVar31 = plane->D;
    dVar114 = plane->negiC;
    dVar44 = ViewPos.Z - (dVar44 * dVar41 + dVar45 * dVar113 + dVar31) * dVar114;
    sVar14 = wallc->sx2;
    iVar27 = (int)sVar14;
    dVar45 = dVar44;
    if (iVar27 <= iVar30 + 1) goto LAB_0030cc47;
    pvVar16 = curline->v1;
  }
  dVar45 = (pvVar16->p).X;
  dVar49 = (pvVar16->p).Y;
  if (viewwidth == iVar27) {
    fVar37 = (wallc->tright).X;
    fVar40 = (wallc->tright).Y;
    fVar51 = ((wallc->tleft).X - ((wallc->tleft).Y + fVar37)) + fVar40;
    if (fVar51 != 0.0) {
      dVar50 = (double)(fVar40 - fVar37) / (double)fVar51;
      dVar45 = dVar45 + dVar50 * (dVar46 - dVar45);
      dVar49 = dVar49 + dVar50 * (dVar52 - dVar49);
    }
  }
  dVar45 = ViewPos.Z - (dVar49 * dVar41 + dVar31 + dVar45 * dVar113) * dVar114;
LAB_0030cc47:
  dVar113 = (double)wallc->sz1;
  dVar41 = globaluclip * dVar113;
  local_68 = (double)wallc->sz2;
  dVar52 = globaldclip * dVar113;
  dVar46 = globaldclip * local_68;
  iVar15 = (uint)(dVar44 < dVar41) + (uint)(dVar45 < globaluclip * local_68) * 2;
  iVar26 = (uint)(dVar46 < dVar45) * 8 + (uint)(dVar52 < dVar44) * 4;
  sVar29 = (short)iVar30;
  if (iVar15 == 3) {
    memset(mostbuf + sVar29,0,(long)(iVar27 - iVar30) * 2);
  }
  else if (iVar26 == 0xc) {
    if (sVar14 != sVar29) {
      lVar28 = (ulong)(uint)(iVar27 - iVar30) - 1;
      auVar32._8_4_ = (int)lVar28;
      auVar32._0_8_ = lVar28;
      auVar32._12_4_ = (int)((ulong)lVar28 >> 0x20);
      uVar23 = 0;
      auVar32 = auVar32 ^ _DAT_0073b300;
      auVar62 = _DAT_0073c180;
      auVar106 = _DAT_0073c190;
      auVar112 = _DAT_0073c1a0;
      auVar66 = _DAT_0073b2f0;
      do {
        auVar53 = auVar66 ^ auVar12;
        iVar93 = auVar32._0_4_;
        iVar92 = -(uint)(iVar93 < auVar53._0_4_);
        iVar20 = auVar32._4_4_;
        auVar54._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
        iVar101 = auVar32._8_4_;
        iVar100 = -(uint)(iVar101 < auVar53._8_4_);
        iVar103 = auVar32._12_4_;
        auVar54._12_4_ = -(uint)(iVar103 < auVar53._12_4_);
        auVar81._4_4_ = iVar92;
        auVar81._0_4_ = iVar92;
        auVar81._8_4_ = iVar100;
        auVar81._12_4_ = iVar100;
        auVar104 = pshuflw(in_XMM11,auVar81,0xe8);
        auVar56._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
        auVar56._12_4_ = -(uint)(auVar53._12_4_ == iVar103);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar111 = pshuflw(in_XMM12,auVar56,0xe8);
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar105 = pshuflw(auVar104,auVar54,0xe8);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar105 | auVar111 & auVar104) ^ auVar53;
        auVar53 = packssdw(auVar53,auVar53);
        if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23] = sVar13;
        }
        auVar54 = auVar56 & auVar81 | auVar54;
        auVar53 = packssdw(auVar54,auVar54);
        auVar105._8_4_ = 0xffffffff;
        auVar105._0_8_ = 0xffffffffffffffff;
        auVar105._12_4_ = 0xffffffff;
        auVar53 = packssdw(auVar53 ^ auVar105,auVar53 ^ auVar105);
        if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
          mostbuf[(long)sVar29 + uVar23 + 1] = sVar13;
        }
        auVar53 = auVar112 ^ auVar12;
        iVar92 = -(uint)(iVar93 < auVar53._0_4_);
        auVar94._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
        iVar100 = -(uint)(iVar101 < auVar53._8_4_);
        auVar94._12_4_ = -(uint)(iVar103 < auVar53._12_4_);
        auVar55._4_4_ = iVar92;
        auVar55._0_4_ = iVar92;
        auVar55._8_4_ = iVar100;
        auVar55._12_4_ = iVar100;
        auVar80._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
        auVar80._12_4_ = -(uint)(auVar53._12_4_ == iVar103);
        auVar80._0_4_ = auVar80._4_4_;
        auVar80._8_4_ = auVar80._12_4_;
        auVar94._0_4_ = auVar94._4_4_;
        auVar94._8_4_ = auVar94._12_4_;
        auVar53 = auVar80 & auVar55 | auVar94;
        auVar53 = packssdw(auVar53,auVar53);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar53 = packssdw(auVar53 ^ auVar2,auVar53 ^ auVar2);
        if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 2] = sVar13;
        }
        auVar56 = pshufhw(auVar55,auVar55,0x84);
        auVar81 = pshufhw(auVar80,auVar80,0x84);
        auVar54 = pshufhw(auVar56,auVar94,0x84);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar54 | auVar81 & auVar56) ^ auVar57;
        auVar56 = packssdw(auVar57,auVar57);
        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 3] = sVar13;
        }
        auVar56 = auVar106 ^ auVar12;
        iVar92 = -(uint)(iVar93 < auVar56._0_4_);
        auVar59._4_4_ = -(uint)(iVar20 < auVar56._4_4_);
        iVar100 = -(uint)(iVar101 < auVar56._8_4_);
        auVar59._12_4_ = -(uint)(iVar103 < auVar56._12_4_);
        auVar82._4_4_ = iVar92;
        auVar82._0_4_ = iVar92;
        auVar82._8_4_ = iVar100;
        auVar82._12_4_ = iVar100;
        auVar53 = pshuflw(auVar53,auVar82,0xe8);
        auVar58._4_4_ = -(uint)(auVar56._4_4_ == iVar20);
        auVar58._12_4_ = -(uint)(auVar56._12_4_ == iVar103);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar56 = pshuflw(auVar111 & auVar104,auVar58,0xe8);
        in_XMM12 = auVar56 & auVar53;
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar53 = pshuflw(auVar53,auVar59,0xe8);
        auVar104._8_4_ = 0xffffffff;
        auVar104._0_8_ = 0xffffffffffffffff;
        auVar104._12_4_ = 0xffffffff;
        auVar104 = (auVar53 | in_XMM12) ^ auVar104;
        auVar53 = packssdw(auVar104,auVar104);
        if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 4] = sVar13;
        }
        auVar59 = auVar58 & auVar82 | auVar59;
        auVar53 = packssdw(auVar59,auVar59);
        auVar111._8_4_ = 0xffffffff;
        auVar111._0_8_ = 0xffffffffffffffff;
        auVar111._12_4_ = 0xffffffff;
        auVar53 = packssdw(auVar53 ^ auVar111,auVar53 ^ auVar111);
        if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 5] = sVar13;
        }
        auVar53 = auVar62 ^ auVar12;
        iVar93 = -(uint)(iVar93 < auVar53._0_4_);
        auVar95._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
        iVar101 = -(uint)(iVar101 < auVar53._8_4_);
        auVar95._12_4_ = -(uint)(iVar103 < auVar53._12_4_);
        auVar60._4_4_ = iVar93;
        auVar60._0_4_ = iVar93;
        auVar60._8_4_ = iVar101;
        auVar60._12_4_ = iVar101;
        auVar83._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
        auVar83._12_4_ = -(uint)(auVar53._12_4_ == iVar103);
        auVar83._0_4_ = auVar83._4_4_;
        auVar83._8_4_ = auVar83._12_4_;
        auVar95._0_4_ = auVar95._4_4_;
        auVar95._8_4_ = auVar95._12_4_;
        auVar53 = auVar83 & auVar60 | auVar95;
        auVar53 = packssdw(auVar53,auVar53);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar53 ^ auVar3,auVar53 ^ auVar3);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 6] = sVar13;
        }
        auVar53 = pshufhw(auVar60,auVar60,0x84);
        auVar54 = pshufhw(auVar83,auVar83,0x84);
        auVar56 = pshufhw(auVar53,auVar95,0x84);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar56 | auVar54 & auVar53) ^ auVar61;
        auVar53 = packssdw(auVar61,auVar61);
        if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          mostbuf[(long)sVar29 + uVar23 + 7] = sVar13;
        }
        uVar23 = uVar23 + 8;
        lVar28 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + 8;
        auVar66._8_8_ = lVar28 + 8;
        lVar28 = auVar112._8_8_;
        auVar112._0_8_ = auVar112._0_8_ + 8;
        auVar112._8_8_ = lVar28 + 8;
        lVar28 = auVar106._8_8_;
        auVar106._0_8_ = auVar106._0_8_ + 8;
        auVar106._8_8_ = lVar28 + 8;
        lVar28 = auVar62._8_8_;
        auVar62._0_8_ = auVar62._0_8_ + 8;
        auVar62._8_8_ = lVar28 + 8;
      } while (((ulong)(uint)(iVar27 - iVar30) + 7 & 0xfffffffffffffff8) != uVar23);
    }
  }
  else {
    dVar114 = dVar44;
    dVar31 = dVar45;
    if (iVar15 != 0) {
      dVar49 = (dVar44 - dVar41) / ((dVar44 - (dVar41 + dVar45)) + globaluclip * local_68);
      dVar41 = (double)(wallc->sz2 - wallc->sz1) * dVar49 + dVar113;
      dVar31 = (dVar45 - dVar44) * dVar49 + dVar44;
      iVar93 = SUB84(((double)(iVar27 - iVar30) * local_68 * dVar49) / dVar41 + 6755399441055744.0,0
                    );
      iVar20 = iVar30 + iVar93;
      if (iVar15 == 2) {
        iVar101 = iVar20;
        if (iVar93 < 0) {
          dVar31 = dVar45;
          dVar41 = local_68;
          iVar101 = iVar27;
        }
        local_68 = dVar41;
        memset(mostbuf + iVar20,0,(long)(iVar27 - iVar20) * 2);
        iVar27 = iVar101;
      }
      else {
        dVar114 = dVar31;
        if (iVar27 < iVar20) {
          dVar114 = dVar44;
          iVar20 = iVar30;
          dVar41 = dVar113;
        }
        dVar113 = dVar41;
        iVar30 = iVar20;
        memset(mostbuf + sVar29,0,(long)iVar93 * 2);
        dVar31 = dVar45;
      }
    }
    sVar13 = (short)viewheight;
    auVar12 = _DAT_0073b300;
    if (iVar26 != 0) {
      dVar46 = (dVar44 - dVar52) / ((dVar46 + dVar44) - (dVar52 + dVar45));
      dVar41 = (double)(wallc->sz2 - wallc->sz1) * dVar46 + (double)wallc->sz1;
      iVar93 = (int)wallc->sx1;
      iVar20 = (int)wallc->sx2;
      dVar44 = (dVar45 - dVar44) * dVar46 + dVar44;
      uVar17 = SUB84(((double)(iVar20 - iVar93) * (double)wallc->sz2 * dVar46) / dVar41 +
                     6755399441055744.0,0);
      iVar101 = uVar17 + iVar93;
      if (iVar26 == 8) {
        if (-1 < (int)uVar17) {
          dVar31 = dVar44;
          local_68 = dVar41;
          iVar27 = iVar101;
        }
        uVar17 = iVar20 - iVar101;
        if (uVar17 != 0 && iVar101 <= iVar20) {
          lVar28 = (ulong)uVar17 - 1;
          auVar33._8_4_ = (int)lVar28;
          auVar33._0_8_ = lVar28;
          auVar33._12_4_ = (int)((ulong)lVar28 >> 0x20);
          uVar23 = 0;
          auVar33 = auVar33 ^ _DAT_0073b300;
          auVar35 = _DAT_0073c180;
          auVar38 = _DAT_0073c190;
          auVar42 = _DAT_0073c1a0;
          auVar47 = _DAT_0073b2f0;
          do {
            auVar62 = auVar47 ^ auVar12;
            iVar93 = auVar33._0_4_;
            iVar100 = -(uint)(iVar93 < auVar62._0_4_);
            iVar20 = auVar33._4_4_;
            auVar64._4_4_ = -(uint)(iVar20 < auVar62._4_4_);
            iVar103 = auVar33._8_4_;
            iVar102 = -(uint)(iVar103 < auVar62._8_4_);
            iVar92 = auVar33._12_4_;
            auVar64._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar84._4_4_ = iVar100;
            auVar84._0_4_ = iVar100;
            auVar84._8_4_ = iVar102;
            auVar84._12_4_ = iVar102;
            auVar106 = pshuflw(in_XMM11,auVar84,0xe8);
            auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar20);
            auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar112 = pshuflw(in_XMM12,auVar63,0xe8);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar62 = pshuflw(auVar106,auVar64,0xe8);
            auVar107._8_4_ = 0xffffffff;
            auVar107._0_8_ = 0xffffffffffffffff;
            auVar107._12_4_ = 0xffffffff;
            auVar107 = (auVar62 | auVar112 & auVar106) ^ auVar107;
            auVar62 = packssdw(auVar107,auVar107);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23] = sVar13;
            }
            auVar64 = auVar63 & auVar84 | auVar64;
            auVar62 = packssdw(auVar64,auVar64);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar4,auVar62 ^ auVar4);
            if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
              mostbuf[(long)iVar101 + uVar23 + 1] = sVar13;
            }
            auVar62 = auVar42 ^ auVar12;
            iVar100 = -(uint)(iVar93 < auVar62._0_4_);
            auVar96._4_4_ = -(uint)(iVar20 < auVar62._4_4_);
            iVar102 = -(uint)(iVar103 < auVar62._8_4_);
            auVar96._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar65._4_4_ = iVar100;
            auVar65._0_4_ = iVar100;
            auVar65._8_4_ = iVar102;
            auVar65._12_4_ = iVar102;
            auVar85._4_4_ = -(uint)(auVar62._4_4_ == iVar20);
            auVar85._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            auVar96._0_4_ = auVar96._4_4_;
            auVar96._8_4_ = auVar96._12_4_;
            auVar62 = auVar85 & auVar65 | auVar96;
            auVar62 = packssdw(auVar62,auVar62);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar5,auVar62 ^ auVar5);
            if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 2] = sVar13;
            }
            auVar66 = pshufhw(auVar65,auVar65,0x84);
            auVar53 = pshufhw(auVar85,auVar85,0x84);
            auVar32 = pshufhw(auVar66,auVar96,0x84);
            auVar67._8_4_ = 0xffffffff;
            auVar67._0_8_ = 0xffffffffffffffff;
            auVar67._12_4_ = 0xffffffff;
            auVar67 = (auVar32 | auVar53 & auVar66) ^ auVar67;
            auVar66 = packssdw(auVar67,auVar67);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 3] = sVar13;
            }
            auVar66 = auVar38 ^ auVar12;
            iVar100 = -(uint)(iVar93 < auVar66._0_4_);
            auVar69._4_4_ = -(uint)(iVar20 < auVar66._4_4_);
            iVar102 = -(uint)(iVar103 < auVar66._8_4_);
            auVar69._12_4_ = -(uint)(iVar92 < auVar66._12_4_);
            auVar86._4_4_ = iVar100;
            auVar86._0_4_ = iVar100;
            auVar86._8_4_ = iVar102;
            auVar86._12_4_ = iVar102;
            auVar62 = pshuflw(auVar62,auVar86,0xe8);
            auVar68._4_4_ = -(uint)(auVar66._4_4_ == iVar20);
            auVar68._12_4_ = -(uint)(auVar66._12_4_ == iVar92);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar106 = pshuflw(auVar112 & auVar106,auVar68,0xe8);
            in_XMM12 = auVar106 & auVar62;
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar62 = pshuflw(auVar62,auVar69,0xe8);
            auVar108._8_4_ = 0xffffffff;
            auVar108._0_8_ = 0xffffffffffffffff;
            auVar108._12_4_ = 0xffffffff;
            auVar108 = (auVar62 | in_XMM12) ^ auVar108;
            auVar62 = packssdw(auVar108,auVar108);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 4] = sVar13;
            }
            auVar69 = auVar68 & auVar86 | auVar69;
            auVar62 = packssdw(auVar69,auVar69);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
            if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 5] = sVar13;
            }
            auVar62 = auVar35 ^ auVar12;
            iVar93 = -(uint)(iVar93 < auVar62._0_4_);
            auVar97._4_4_ = -(uint)(iVar20 < auVar62._4_4_);
            iVar103 = -(uint)(iVar103 < auVar62._8_4_);
            auVar97._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar70._4_4_ = iVar93;
            auVar70._0_4_ = iVar93;
            auVar70._8_4_ = iVar103;
            auVar70._12_4_ = iVar103;
            auVar87._4_4_ = -(uint)(auVar62._4_4_ == iVar20);
            auVar87._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar97._0_4_ = auVar97._4_4_;
            auVar97._8_4_ = auVar97._12_4_;
            auVar62 = auVar87 & auVar70 | auVar97;
            auVar62 = packssdw(auVar62,auVar62);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            in_XMM11 = packssdw(auVar62 ^ auVar7,auVar62 ^ auVar7);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 6] = sVar13;
            }
            auVar62 = pshufhw(auVar70,auVar70,0x84);
            auVar112 = pshufhw(auVar87,auVar87,0x84);
            auVar106 = pshufhw(auVar62,auVar97,0x84);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            auVar71 = (auVar106 | auVar112 & auVar62) ^ auVar71;
            auVar62 = packssdw(auVar71,auVar71);
            if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar101 + uVar23 + 7] = sVar13;
            }
            uVar23 = uVar23 + 8;
            lVar28 = auVar47._8_8_;
            auVar47._0_8_ = auVar47._0_8_ + 8;
            auVar47._8_8_ = lVar28 + 8;
            lVar28 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 8;
            auVar42._8_8_ = lVar28 + 8;
            lVar28 = auVar38._8_8_;
            auVar38._0_8_ = auVar38._0_8_ + 8;
            auVar38._8_8_ = lVar28 + 8;
            lVar28 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 8;
            auVar35._8_8_ = lVar28 + 8;
          } while (((ulong)uVar17 + 7 & 0xfffffffffffffff8) != uVar23);
        }
      }
      else {
        if (iVar101 <= iVar20) {
          dVar114 = dVar44;
          dVar113 = dVar41;
          iVar30 = iVar101;
        }
        if (0 < (int)uVar17) {
          lVar28 = (ulong)(uVar17 & 0x7fffffff) - 1;
          auVar34._8_4_ = (int)lVar28;
          auVar34._0_8_ = lVar28;
          auVar34._12_4_ = (int)((ulong)lVar28 >> 0x20);
          uVar23 = 0;
          auVar34 = auVar34 ^ _DAT_0073b300;
          auVar36 = _DAT_0073c180;
          auVar39 = _DAT_0073c190;
          auVar43 = _DAT_0073c1a0;
          auVar48 = _DAT_0073b2f0;
          do {
            auVar62 = auVar48 ^ auVar12;
            iVar20 = auVar34._0_4_;
            iVar100 = -(uint)(iVar20 < auVar62._0_4_);
            iVar101 = auVar34._4_4_;
            auVar73._4_4_ = -(uint)(iVar101 < auVar62._4_4_);
            iVar103 = auVar34._8_4_;
            iVar102 = -(uint)(iVar103 < auVar62._8_4_);
            iVar92 = auVar34._12_4_;
            auVar73._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar88._4_4_ = iVar100;
            auVar88._0_4_ = iVar100;
            auVar88._8_4_ = iVar102;
            auVar88._12_4_ = iVar102;
            auVar106 = pshuflw(in_XMM11,auVar88,0xe8);
            auVar72._4_4_ = -(uint)(auVar62._4_4_ == iVar101);
            auVar72._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar112 = pshuflw(in_XMM12,auVar72,0xe8);
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar62 = pshuflw(auVar106,auVar73,0xe8);
            auVar109._8_4_ = 0xffffffff;
            auVar109._0_8_ = 0xffffffffffffffff;
            auVar109._12_4_ = 0xffffffff;
            auVar109 = (auVar62 | auVar112 & auVar106) ^ auVar109;
            auVar62 = packssdw(auVar109,auVar109);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23] = sVar13;
            }
            auVar73 = auVar72 & auVar88 | auVar73;
            auVar62 = packssdw(auVar73,auVar73);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar8,auVar62 ^ auVar8);
            if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
              mostbuf[(long)iVar93 + uVar23 + 1] = sVar13;
            }
            auVar62 = auVar43 ^ auVar12;
            iVar100 = -(uint)(iVar20 < auVar62._0_4_);
            auVar98._4_4_ = -(uint)(iVar101 < auVar62._4_4_);
            iVar102 = -(uint)(iVar103 < auVar62._8_4_);
            auVar98._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar74._4_4_ = iVar100;
            auVar74._0_4_ = iVar100;
            auVar74._8_4_ = iVar102;
            auVar74._12_4_ = iVar102;
            auVar89._4_4_ = -(uint)(auVar62._4_4_ == iVar101);
            auVar89._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar98._0_4_ = auVar98._4_4_;
            auVar98._8_4_ = auVar98._12_4_;
            auVar62 = auVar89 & auVar74 | auVar98;
            auVar62 = packssdw(auVar62,auVar62);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar9,auVar62 ^ auVar9);
            if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 2] = sVar13;
            }
            auVar66 = pshufhw(auVar74,auVar74,0x84);
            auVar53 = pshufhw(auVar89,auVar89,0x84);
            auVar32 = pshufhw(auVar66,auVar98,0x84);
            auVar75._8_4_ = 0xffffffff;
            auVar75._0_8_ = 0xffffffffffffffff;
            auVar75._12_4_ = 0xffffffff;
            auVar75 = (auVar32 | auVar53 & auVar66) ^ auVar75;
            auVar66 = packssdw(auVar75,auVar75);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 3] = sVar13;
            }
            auVar66 = auVar39 ^ auVar12;
            iVar100 = -(uint)(iVar20 < auVar66._0_4_);
            auVar77._4_4_ = -(uint)(iVar101 < auVar66._4_4_);
            iVar102 = -(uint)(iVar103 < auVar66._8_4_);
            auVar77._12_4_ = -(uint)(iVar92 < auVar66._12_4_);
            auVar90._4_4_ = iVar100;
            auVar90._0_4_ = iVar100;
            auVar90._8_4_ = iVar102;
            auVar90._12_4_ = iVar102;
            auVar62 = pshuflw(auVar62,auVar90,0xe8);
            auVar76._4_4_ = -(uint)(auVar66._4_4_ == iVar101);
            auVar76._12_4_ = -(uint)(auVar66._12_4_ == iVar92);
            auVar76._0_4_ = auVar76._4_4_;
            auVar76._8_4_ = auVar76._12_4_;
            auVar106 = pshuflw(auVar112 & auVar106,auVar76,0xe8);
            in_XMM12 = auVar106 & auVar62;
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar62 = pshuflw(auVar62,auVar77,0xe8);
            auVar110._8_4_ = 0xffffffff;
            auVar110._0_8_ = 0xffffffffffffffff;
            auVar110._12_4_ = 0xffffffff;
            auVar110 = (auVar62 | in_XMM12) ^ auVar110;
            auVar62 = packssdw(auVar110,auVar110);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 4] = sVar13;
            }
            auVar77 = auVar76 & auVar90 | auVar77;
            auVar62 = packssdw(auVar77,auVar77);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar10,auVar62 ^ auVar10);
            if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 5] = sVar13;
            }
            auVar62 = auVar36 ^ auVar12;
            iVar20 = -(uint)(iVar20 < auVar62._0_4_);
            auVar99._4_4_ = -(uint)(iVar101 < auVar62._4_4_);
            iVar103 = -(uint)(iVar103 < auVar62._8_4_);
            auVar99._12_4_ = -(uint)(iVar92 < auVar62._12_4_);
            auVar78._4_4_ = iVar20;
            auVar78._0_4_ = iVar20;
            auVar78._8_4_ = iVar103;
            auVar78._12_4_ = iVar103;
            auVar91._4_4_ = -(uint)(auVar62._4_4_ == iVar101);
            auVar91._12_4_ = -(uint)(auVar62._12_4_ == iVar92);
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar99._0_4_ = auVar99._4_4_;
            auVar99._8_4_ = auVar99._12_4_;
            auVar62 = auVar91 & auVar78 | auVar99;
            auVar62 = packssdw(auVar62,auVar62);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            in_XMM11 = packssdw(auVar62 ^ auVar11,auVar62 ^ auVar11);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 6] = sVar13;
            }
            auVar62 = pshufhw(auVar78,auVar78,0x84);
            auVar112 = pshufhw(auVar91,auVar91,0x84);
            auVar106 = pshufhw(auVar62,auVar99,0x84);
            auVar79._8_4_ = 0xffffffff;
            auVar79._0_8_ = 0xffffffffffffffff;
            auVar79._12_4_ = 0xffffffff;
            auVar79 = (auVar106 | auVar112 & auVar62) ^ auVar79;
            auVar62 = packssdw(auVar79,auVar79);
            if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              mostbuf[(long)iVar93 + uVar23 + 7] = sVar13;
            }
            uVar23 = uVar23 + 8;
            lVar28 = auVar48._8_8_;
            auVar48._0_8_ = auVar48._0_8_ + 8;
            auVar48._8_8_ = lVar28 + 8;
            lVar28 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + 8;
            auVar43._8_8_ = lVar28 + 8;
            lVar28 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 8;
            auVar39._8_8_ = lVar28 + 8;
            lVar28 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 8;
            auVar36._8_8_ = lVar28 + 8;
          } while ((uVar17 + 7 & 0xfffffff8) != uVar23);
        }
      }
    }
    dVar113 = (dVar114 * InvZtoScale) / dVar113;
    uVar17 = iVar27 - iVar30;
    if (uVar17 != 0) {
      if (uVar17 != 0) {
        puVar18 = (uint *)(mostbuf + iVar30);
        uVar21 = SUB84(dVar113 + 103079215104.0 + CenterY,0) + 0x8000;
        iVar30 = SUB84(((InvZtoScale * dVar31) / local_68 - dVar113) / (double)(int)uVar17 +
                       103079215104.0,0);
        if (((ulong)puVar18 & 2) != 0) {
          *(short *)puVar18 = (short)(uVar21 >> 0x10);
          puVar18 = (uint *)((long)puVar18 + 2);
          uVar17 = uVar17 - 1;
          uVar21 = uVar21 + iVar30;
        }
        if (1 < uVar17) {
          uVar25 = uVar17 >> 1;
          puVar19 = puVar18;
          do {
            uVar24 = uVar21 + iVar30;
            uVar22 = uVar21 >> 0x10;
            puVar18 = puVar19 + 1;
            uVar21 = uVar24 + iVar30;
            *puVar19 = uVar22 | uVar24 & 0xffff0000;
            uVar25 = uVar25 - 1;
            puVar19 = puVar18;
          } while (uVar25 != 0);
        }
        if ((uVar17 & 1) != 0) {
          *(short *)puVar18 = (short)(uVar21 >> 0x10);
        }
      }
    }
    else {
      mostbuf[iVar27] = SUB82(dVar113 + 6755399441055744.0 + CenterY,0);
    }
  }
  return iVar26 + iVar15;
}

Assistant:

int WallMost (short *mostbuf, const secplane_t &plane, const FWallCoords *wallc)
{
	if (!plane.isSlope())
	{
		return OWallMost(mostbuf, plane.Zat0() - ViewPos.Z, wallc);
	}

	double x, y, den, z1, z2, oz1, oz2;
	double s1, s2, s3, s4;
	int bad, ix1, ix2;
	double iy1, iy2;

	// Get Z coordinates at both ends of the line
	if (MirrorFlags & RF_XFLIP)
	{
		x = curline->v2->fX();
		y = curline->v2->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x -= frac * (x - curline->v1->fX());
			y -= frac * (y - curline->v1->fY());
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v1->fX();
			y = curline->v1->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x += frac * (curline->v2->fX() - x);
				y += frac * (curline->v2->fY() - y);
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}
	else
	{
		x = curline->v1->fX();
		y = curline->v1->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x += frac * (curline->v2->fX() - x);
			y += frac * (curline->v2->fY() - y);
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v2->fX();
			y = curline->v2->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x -= frac * (x - curline->v1->fX());
				y -= frac * (y - curline->v1->fY());
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}

	s1 = globaluclip * wallc->sz1; s2 = globaluclip * wallc->sz2;
	s3 = globaldclip * wallc->sz1; s4 = globaldclip * wallc->sz2;
	bad = (z1<s1)+((z2<s2)<<1)+((z1>s3)<<2)+((z2>s4)<<3);

	ix1 = wallc->sx1; ix2 = wallc->sx2;
	iy1 = wallc->sz1; iy2 = wallc->sz2;
	oz1 = z1; oz2 = z2;

	if ((bad&3) == 3)
	{ // The entire line is above the screen
		memset (&mostbuf[ix1], 0, (ix2-ix1)*sizeof(mostbuf[0]));
		return bad;
	}

	if ((bad&12) == 12)
	{ // The entire line is below the screen
		clearbufshort (&mostbuf[ix1], ix2-ix1, viewheight);
		return bad;

	}

	if (bad&3)
	{ // The line intersects the top of the screen
			//inty = intz / (globaluclip>>16)
		double t = (oz1-s1) / (s2-s1+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&3) == 2)
		{ // The right side of the line is above the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			memset (&mostbuf[xcross], 0, (wallc->sx2-xcross)*sizeof(mostbuf[0]));
		}
		else
		{ // The left side of the line is above the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			memset (&mostbuf[wallc->sx1], 0, (xcross-wallc->sx1)*sizeof(mostbuf[0]));
		}
	}

	if (bad&12)
	{ // The line intersects the bottom of the screen
			//inty = intz / (globaldclip>>16)
		double t = (oz1-s3) / (s4-s3+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&12) == 8)
		{ // The right side of the line is below the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			if (wallc->sx2 > xcross) clearbufshort (&mostbuf[xcross], wallc->sx2-xcross, viewheight);
		}
		else
		{ // The left side of the line is below the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			if (xcross > wallc->sx1) clearbufshort (&mostbuf[wallc->sx1], xcross-wallc->sx1, viewheight);
		}
	}

	y = z1 * InvZtoScale / iy1;
	if (ix2 == ix1)
	{
		mostbuf[ix1] = (short)xs_RoundToInt(y + CenterY);
	}
	else
	{
		fixed_t yinc = FLOAT2FIXED(((z2 * InvZtoScale / iy2) - y) / (ix2-ix1));
		qinterpolatedown16short (&mostbuf[ix1], ix2-ix1, FLOAT2FIXED(y + CenterY) + FRACUNIT/2, yinc);
	}

	return bad;
}